

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *pTVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  long lVar5;
  bool bVar6;
  string shader_source;
  long *local_100 [2];
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::ES> *local_c0;
  long local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_b8 = 1;
  lVar5 = 7;
  local_c0 = this;
  do {
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e0,shader_start_abi_cxx11_,DAT_02233658 + shader_start_abi_cxx11_);
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"    float","");
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"[2]","");
    (*(local_c0->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
      super_TestNode._vptr_TestNode[6])(local_100,local_c0,local_b0,(string *)local_50,local_b8);
    std::__cxx11::string::_M_append((char *)local_e0,(ulong)local_100[0]);
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0],local_f0[0] + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70," x","");
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"[2]","");
    (*(local_c0->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
      super_TestNode._vptr_TestNode[6])
              (local_100,local_c0,(string *)local_70,(string *)local_90,lVar5);
    std::__cxx11::string::_M_append((char *)local_e0,(ulong)local_100[0]);
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0],local_f0[0] + 1);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    std::__cxx11::string::append((char *)local_e0);
    puVar1 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
    case COMPUTE_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)local_e0);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar1 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)local_e0,*puVar1);
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x5d7);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)local_e0,shader_end_abi_cxx11_);
    puVar3 = empty_string_abi_cxx11_;
    puVar4 = empty_string_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puVar4 = default_vertex_shader_source_abi_cxx11_;
      puVar3 = (undefined1 *)local_e0;
      break;
    case VERTEX_SHADER_TYPE:
      puVar4 = (undefined1 *)local_e0;
      goto LAB_00b34647;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
    case TESSELATION_CONTROL_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      puVar4 = default_vertex_shader_source_abi_cxx11_;
LAB_00b34647:
      puVar3 = default_fragment_shader_source_abi_cxx11_;
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x5da);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(local_c0->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
      super_TestNode._vptr_TestNode[9])(local_c0,puVar4,puVar3,1,0);
    if (local_e0[0] != local_d0) {
      operator_delete(local_e0[0],local_d0[0] + 1);
    }
    local_b8 = local_b8 + 1;
    bVar6 = lVar5 == 0;
    lVar5 = lVar5 + -1;
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

void SizedDeclarationsTypenameStyle1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string shader_source = shader_start;

		shader_source += this->extend_string("    float", "[2]", max_dimension_index);
		shader_source += this->extend_string(" x", "[2]", API::MAX_ARRAY_DIMENSIONS - max_dimension_index);
		shader_source += ";\n";

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}